

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1195::run(TestCase1195 *this)

{
  word **this_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ArrayPtr<const_capnp::word> *pAVar4;
  size_t sVar5;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t __length;
  __off_t extraout_RDX_01;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar6;
  uint local_244 [2];
  bool local_239;
  uint local_238;
  int iStack_234;
  bool _kj_shouldLog_6;
  bool local_22d;
  uint local_22c;
  uint uStack_228;
  bool _kj_shouldLog_5;
  uint i_2;
  bool local_21d;
  uint local_21c;
  uint uStack_218;
  bool _kj_shouldLog_4;
  bool local_211;
  uint local_210;
  uint uStack_20c;
  bool _kj_shouldLog_3;
  uint i_1;
  bool local_201;
  undefined1 local_200 [7];
  bool _kj_shouldLog_2;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> reader;
  size_t local_1c0;
  int local_1b8;
  bool local_1b1;
  undefined1 auStack_1b0 [7];
  bool _kj_shouldLog_1;
  size_t local_1a8;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_1a0;
  size_t local_190;
  int local_188;
  bool local_181;
  undefined1 auStack_180 [7];
  bool _kj_shouldLog;
  size_t local_178;
  uint local_16c;
  undefined1 local_168 [4];
  uint i;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> builder;
  Orphanage local_130;
  undefined1 local_120 [8];
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> orphan;
  MallocMessageBuilder message;
  TestCase1195 *this_local;
  
  this_00 = &orphan.builder.location;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  local_130 = MessageBuilder::getOrphanage((MessageBuilder *)this_00);
  Orphanage::newOrphan<capnp::List<unsigned_int,(capnp::Kind)0>>
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120,&local_130,7);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get
            ((BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_168,
             (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120);
  for (local_16c = 0; local_16c < 7; local_16c = local_16c + 1) {
    List<unsigned_int,_(capnp::Kind)0>::Builder::set
              ((Builder *)local_168,local_16c,local_16c + 0x75bcd15);
  }
  _auStack_180 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&orphan.builder.location);
  pAVar4 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_180,0);
  sVar5 = kj::ArrayPtr<const_capnp::word>::size(pAVar4);
  __length = extraout_RDX;
  if (sVar5 != 5) {
    local_181 = kj::_::Debug::shouldLog(ERROR);
    __length = extraout_RDX_00;
    while (local_181 != false) {
      local_188 = 5;
      AVar6 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&orphan.builder.location);
      local_1a0 = AVar6;
      pAVar4 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[](&local_1a0,0);
      local_190 = kj::ArrayPtr<const_capnp::word>::size(pAVar4);
      kj::_::Debug::log<char_const(&)[67],int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4b3,ERROR,
                 "\"failed: expected \" \"(5) == (message.getSegmentsForOutput()[0].size())\", 5, message.getSegmentsForOutput()[0].size()"
                 ,(char (*) [67])
                  "failed: expected (5) == (message.getSegmentsForOutput()[0].size())",&local_188,
                 &local_190);
      __length = extraout_RDX_01;
      local_181 = false;
    }
  }
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::truncate
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120,(char *)0x3,__length);
  _auStack_1b0 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&orphan.builder.location);
  pAVar4 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_1b0,0);
  sVar5 = kj::ArrayPtr<const_capnp::word>::size(pAVar4);
  if (sVar5 != 3) {
    local_1b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1b1 != false) {
      local_1b8 = 3;
      AVar6 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&orphan.builder.location);
      reader.reader._40_8_ = AVar6.ptr;
      pAVar4 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)
                          &reader.reader.nestingLimit,0);
      local_1c0 = kj::ArrayPtr<const_capnp::word>::size(pAVar4);
      kj::_::Debug::log<char_const(&)[67],int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4b5,ERROR,
                 "\"failed: expected \" \"(3) == (message.getSegmentsForOutput()[0].size())\", 3, message.getSegmentsForOutput()[0].size()"
                 ,(char (*) [67])
                  "failed: expected (3) == (message.getSegmentsForOutput()[0].size())",&local_1b8,
                 &local_1c0);
      local_1b1 = false;
    }
  }
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::getReader
            ((ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_200,
             (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120);
  uVar1 = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)local_200);
  if (uVar1 != 3) {
    local_201 = kj::_::Debug::shouldLog(ERROR);
    while (local_201 != false) {
      i_1 = 3;
      uStack_20c = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)local_200);
      kj::_::Debug::log<char_const(&)[40],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4b8,ERROR,"\"failed: expected \" \"(3) == (reader.size())\", 3, reader.size()",
                 (char (*) [40])"failed: expected (3) == (reader.size())",(int *)&i_1,
                 &stack0xfffffffffffffdf4);
      local_201 = false;
    }
  }
  for (local_210 = 0; local_210 < 3; local_210 = local_210 + 1) {
    uVar2 = local_210 + 0x75bcd15;
    uVar3 = List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]((Builder *)local_168,local_210);
    if (uVar2 != uVar3) {
      local_211 = kj::_::Debug::shouldLog(ERROR);
      while (local_211 != false) {
        uStack_218 = local_210 + 0x75bcd15;
        local_21c = List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]
                              ((Builder *)local_168,local_210);
        kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x4bb,ERROR,
                   "\"failed: expected \" \"(123456789 + i) == (builder[i])\", 123456789 + i, builder[i]"
                   ,(char (*) [49])"failed: expected (123456789 + i) == (builder[i])",
                   &stack0xfffffffffffffde8,&local_21c);
        local_211 = false;
      }
    }
    uVar2 = local_210 + 0x75bcd15;
    uVar3 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_200,local_210);
    if (uVar2 != uVar3) {
      local_21d = kj::_::Debug::shouldLog(ERROR);
      while (local_21d != false) {
        i_2 = local_210 + 0x75bcd15;
        uStack_228 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]
                               ((Reader *)local_200,local_210);
        kj::_::Debug::log<char_const(&)[48],unsigned_int,unsigned_int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x4bc,ERROR,
                   "\"failed: expected \" \"(123456789 + i) == (reader[i])\", 123456789 + i, reader[i]"
                   ,(char (*) [48])"failed: expected (123456789 + i) == (reader[i])",&i_2,
                   &stack0xfffffffffffffdd8);
        local_21d = false;
      }
    }
  }
  for (local_22c = 3; local_22c < 7; local_22c = local_22c + 1) {
    uVar2 = List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]((Builder *)local_168,local_22c);
    if (uVar2 != 0) {
      local_22d = kj::_::Debug::shouldLog(ERROR);
      while (local_22d != false) {
        iStack_234 = 0;
        local_238 = List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]
                              ((Builder *)local_168,local_22c);
        kj::_::Debug::log<char_const(&)[37],int,unsigned_int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x4bf,ERROR,"\"failed: expected \" \"(0) == (builder[i])\", 0, builder[i]",
                   (char (*) [37])"failed: expected (0) == (builder[i])",&stack0xfffffffffffffdcc,
                   &local_238);
        local_22d = false;
      }
    }
  }
  List<unsigned_int,_(capnp::Kind)0>::Builder::set((Builder *)local_168,0,0x141);
  uVar2 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_200,0);
  if (uVar2 != 0x141) {
    local_239 = kj::_::Debug::shouldLog(ERROR);
    while (local_239 != false) {
      local_244[1] = 0x141;
      local_244[0] = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_200,0);
      kj::_::Debug::log<char_const(&)[38],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4c5,ERROR,"\"failed: expected \" \"(321) == (reader[0])\", 321, reader[0]",
                 (char (*) [38])"failed: expected (321) == (reader[0])",(int *)(local_244 + 1),
                 local_244);
      local_239 = false;
    }
  }
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::~Orphan
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&orphan.builder.location);
  return;
}

Assistant:

TEST(Orphans, TruncatePrimitiveList) {
  MallocMessageBuilder message;
  auto orphan = message.getOrphanage().newOrphan<List<uint32_t>>(7);
  auto builder = orphan.get();
  for (uint i = 0; i < 7; i++) {
    builder.set(i, 123456789 + i);
  }

  EXPECT_EQ(5, message.getSegmentsForOutput()[0].size());
  orphan.truncate(3);
  EXPECT_EQ(3, message.getSegmentsForOutput()[0].size());

  auto reader = orphan.getReader();
  EXPECT_EQ(3, reader.size());

  for (uint i = 0; i < 3; i++) {
    EXPECT_EQ(123456789 + i, builder[i]);
    EXPECT_EQ(123456789 + i, reader[i]);
  }
  for (uint i = 3; i < 7; i++) {
    EXPECT_EQ(0, builder[i]);
  }

  // Can't compare pointers directly, but we can check if builder modifications are visible using
  // the reader.
  builder.set(0, 321);
  EXPECT_EQ(321, reader[0]);
}